

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::IsLazyBailOutCurrentlyNeeeded(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  Sym *this_00;
  PropertySym *pPVar6;
  PropertyId id;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar2 = Func::ShouldDoLazyBailOut(this->func);
  if (bVar2) {
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x8b2,"(this->tag == Js::DeadStorePhase)",
                         "this->tag == Js::DeadStorePhase");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = IR::Instr::HasLazyBailOut(instr);
    if ((bVar2) && ((*(ushort *)&this->currentBlock->field_0x18 >> 1 & 1) == 0)) {
      if (this->currentBlock->liveFixedFields == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x8be,"(this->currentBlock->liveFixedFields != nullptr)",
                           "liveFixedField is null, MergeSuccBlocksInfo might have not initialized it?"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      bVar2 = IR::Instr::IsStFldVariant(instr);
      if (bVar2) {
        pOVar5 = IR::Instr::GetDst(instr);
        if (pOVar5 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x8c2,"(instr->GetDst())","instr->GetDst()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pOVar5 = IR::Instr::GetDst(instr);
        this_00 = IR::Opnd::GetSym(pOVar5);
        pPVar6 = Sym::AsPropertySym(this_00);
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->currentBlock->liveFixedFields,pPVar6->m_propertyId);
        this_local._7_1_ = BVar3 != '\0';
      }
      else {
        bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->currentBlock->liveFixedFields);
        this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::IsLazyBailOutCurrentlyNeeeded(IR::Instr * instr) const
{
    if (!this->func->ShouldDoLazyBailOut())
    {
        return false;
    }

    Assert(this->tag == Js::DeadStorePhase);

    // We insert potential lazy bailout points in the forward pass, so if the instruction doesn't
    // have bailout info at this point, we know for sure lazy bailout is not needed.
    if (!instr->HasLazyBailOut() || this->currentBlock->isDead)
    {
        return false;
    }

    AssertMsg(
        this->currentBlock->liveFixedFields != nullptr,
        "liveFixedField is null, MergeSuccBlocksInfo might have not initialized it?"
    );

    if (instr->IsStFldVariant())
    {
        Assert(instr->GetDst());
        Js::PropertyId id = instr->GetDst()->GetSym()->AsPropertySym()->m_propertyId;

        // We only need to protect against SetFld if it is setting to one of the live fixed fields
        return this->currentBlock->liveFixedFields->Test(id);
    }

    return !this->currentBlock->liveFixedFields->IsEmpty();
}